

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::extendForPacking
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literal *value
          ,Field *field,bool signed_)

{
  bool bVar1;
  Literal local_78;
  Literal local_50;
  uint local_34;
  BasicType local_30;
  int32_t c;
  Field *pFStack_28;
  bool signed__local;
  Field *field_local;
  Literal *value_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  local_30 = i32;
  c._3_1_ = signed_;
  pFStack_28 = field;
  field_local = (Field *)value;
  value_local = (Literal *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  bVar1 = Type::operator==(&field->type,&local_30);
  if (bVar1) {
    local_34 = wasm::Literal::geti32(value);
    if (pFStack_28->packedType == i8) {
      if (local_34 != (local_34 & 0xff)) {
        __assert_fail("c == (c & 0xff)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x95a,
                      "Literal wasm::ExpressionRunner<wasm::ModuleRunner>::extendForPacking(Literal, const Field &, bool) [SubType = wasm::ModuleRunner]"
                     );
      }
      if ((c._3_1_ & 1) != 0) {
        wasm::Literal::Literal(&local_50,(int)(char)local_34);
        ::wasm::Literal::operator=(value,&local_50);
        ::wasm::Literal::~Literal(&local_50);
      }
    }
    else if (pFStack_28->packedType == i16) {
      if (local_34 != (local_34 & 0xffff)) {
        __assert_fail("c == (c & 0xffff)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x95f,
                      "Literal wasm::ExpressionRunner<wasm::ModuleRunner>::extendForPacking(Literal, const Field &, bool) [SubType = wasm::ModuleRunner]"
                     );
      }
      if ((c._3_1_ & 1) != 0) {
        wasm::Literal::Literal(&local_78,(int)(short)local_34);
        ::wasm::Literal::operator=(value,&local_78);
        ::wasm::Literal::~Literal(&local_78);
      }
    }
  }
  ::wasm::Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal extendForPacking(Literal value, const Field& field, bool signed_) {
    if (field.type == Type::i32) {
      int32_t c = value.geti32();
      if (field.packedType == Field::i8) {
        // The stored value should already be truncated.
        assert(c == (c & 0xff));
        if (signed_) {
          value = Literal((c << 24) >> 24);
        }
      } else if (field.packedType == Field::i16) {
        assert(c == (c & 0xffff));
        if (signed_) {
          value = Literal((c << 16) >> 16);
        }
      }
    }
    return value;
  }